

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

bool __thiscall google::protobuf::io::CordInputStream::NextChunk(CordInputStream *this,size_t skip)

{
  bool bVar1;
  
  if (this->size_ != 0) {
    absl::lts_20250127::Cord::ChunkIterator::AdvanceBytes
              (&(this->it_).chunk_iterator_,(this->size_ + skip) - this->available_);
    this->bytes_remaining_ = this->bytes_remaining_ - skip;
    bVar1 = LoadChunkData(this);
    return bVar1;
  }
  return false;
}

Assistant:

bool CordInputStream::NextChunk(size_t skip) {
  // `size_ == 0` indicates we're at EOF.
  if (size_ == 0) return false;

  // The caller consumed 'size_ - available_' bytes that are not yet accounted
  // for in the iterator position to get to the start of the next chunk.
  const size_t distance = size_ - available_ + skip;
  absl::Cord::Advance(&it_, distance);
  bytes_remaining_ -= skip;

  return LoadChunkData();
}